

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

Value * __thiscall Kvm::makeIf(Kvm *this,Value *pred,Value *conseq,Value *alternate)

{
  Value *pVVar1;
  undefined1 local_40 [8];
  GcGuard guard;
  Value *result;
  Value *alternate_local;
  Value *conseq_local;
  Value *pred_local;
  Kvm *this_local;
  
  guard.times_ = 0;
  GcGuard::GcGuard((GcGuard *)local_40,&this->gc_);
  GcGuard::pushLocalStackRoot((GcGuard *)local_40,(Value **)&guard.times_);
  guard.times_ = (long)makeCell(this,alternate,this->NIL);
  guard.times_ = (long)makeCell(this,conseq,(Value *)guard.times_);
  guard.times_ = (long)makeCell(this,pred,(Value *)guard.times_);
  pVVar1 = makeCell(this,this->IF,(Value *)guard.times_);
  guard.times_ = (long)pVVar1;
  GcGuard::~GcGuard((GcGuard *)local_40);
  return pVVar1;
}

Assistant:

const Value* Kvm::makeIf(const Value *pred, const Value *conseq, const Value *alternate)
{
    const Value *result = nullptr;
    GcGuard guard{gc_};
    guard.pushLocalStackRoot(&result);
    result = makeCell(alternate, NIL);
    result = makeCell(conseq, result);
    result = makeCell(pred, result);
    result = makeCell(IF, result);
    return result;
}